

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O3

void __thiscall tokenizer::read_current_file(tokenizer *this)

{
  ifstream *piVar1;
  string *this_00;
  byte bVar2;
  char cVar3;
  int iVar4;
  istream *piVar5;
  uint uVar6;
  byte *pbVar7;
  string line;
  byte *local_50;
  undefined8 local_48;
  byte local_40;
  undefined7 uStack_3f;
  
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  this->line_number = 0;
  piVar1 = &this->current_stream;
  this_00 = &this->current_word;
LAB_0010d04f:
  do {
    cVar3 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar1 + -0x18) + (char)piVar1);
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)piVar1,(string *)&local_50,cVar3);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (this_00,0,(this->current_word)._M_string_length,"eof",3);
      add_token_to_stream(this,eof);
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      return;
    }
    this->line_number = this->line_number + 1;
    this->position_number = 1;
    this->line_char = (char *)local_50;
    pbVar7 = local_50;
    while (bVar2 = *pbVar7, bVar2 != 0) {
      if (this->inComment == true) {
LAB_0010d0a9:
        continue_to_read_comment(this);
        goto LAB_0010d0cd;
      }
      if ((bVar2 == 0x20) || (bVar2 == 9)) {
        this->line_char = (char *)(pbVar7 + 1);
        goto LAB_0010d0ca;
      }
      iVar4 = isalpha((int)(char)bVar2);
      if ((bVar2 == 0x5f) || (iVar4 != 0)) {
        read_identifier(this);
        goto LAB_0010d0cd;
      }
      if ((int)(char)bVar2 - 0x30U < 10) {
LAB_0010d0f0:
        read_number(this);
        goto LAB_0010d0cd;
      }
      if (0x7a < bVar2) {
        if (bVar2 == 0x7b) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (this_00,'{');
          add_token_to_stream(this,left_curly_bracket);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(this_00,0,(this->current_word)._M_string_length,"",0);
        }
        else {
          if (bVar2 == 0x7c) goto switchD_0010d126_caseD_21;
          if (bVar2 != 0x7d) goto switchD_0010d126_caseD_23;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (this_00,'}');
          add_token_to_stream(this,right_curly_bracket);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(this_00,0,(this->current_word)._M_string_length,"",0);
        }
        goto LAB_0010d2ba;
      }
      switch(bVar2) {
      case 0x21:
      case 0x25:
      case 0x26:
      case 0x2a:
      case 0x2b:
      case 0x3c:
      case 0x3d:
      case 0x3e:
        break;
      case 0x22:
        this->line_char = (char *)(pbVar7 + 1);
        read_string(this);
        goto LAB_0010d0cd;
      default:
switchD_0010d126_caseD_23:
        this->last_line_number = this->line_number;
        this->last_position_number = this->position_number;
        do {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (this_00,*pbVar7);
          pbVar7 = (byte *)(this->line_char + 1);
          this->line_char = (char *)pbVar7;
          this->position_number = this->position_number + 1;
        } while( true );
      case 0x28:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this_00,'(');
        add_token_to_stream(this,left_round_bracket);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (this_00,0,(this->current_word)._M_string_length,"",0);
        goto LAB_0010d2ba;
      case 0x29:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this_00,')');
        add_token_to_stream(this,right_round_bracket);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (this_00,0,(this->current_word)._M_string_length,"",0);
        goto LAB_0010d2ba;
      case 0x2d:
        if ((int)(char)pbVar7[1] - 0x30U < 10) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (this_00,'-');
          this->line_char = this->line_char + 1;
          this->position_number = this->position_number + 1;
          goto LAB_0010d0f0;
        }
        break;
      case 0x2f:
        if (pbVar7[1] == 0x2a) {
          this->line_char = (char *)(pbVar7 + 2);
          uVar6 = this->position_number + 2;
          this->position_number = uVar6;
          this->last_line_number = this->line_number;
          this->last_position_number = uVar6;
          this->inComment = true;
          goto LAB_0010d0a9;
        }
        if (pbVar7[1] == 0x2f) goto LAB_0010d04f;
        break;
      case 0x3b:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this_00,';');
        add_token_to_stream(this,semicolon);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (this_00,0,(this->current_word)._M_string_length,"",0);
LAB_0010d2ba:
        this->line_char = this->line_char + 1;
LAB_0010d0ca:
        this->position_number = this->position_number + 1;
        goto LAB_0010d0cd;
      }
switchD_0010d126_caseD_21:
      read_symbol(this);
LAB_0010d0cd:
      pbVar7 = (byte *)this->line_char;
    }
  } while( true );
}

Assistant:

void tokenizer::read_current_file() {
    string line;

    line_number = 0;

    while(getline(current_stream, line)) {

        line_number++;
        position_number = 1;

        line_char = line.c_str();

        while(*line_char != '\0') {
            if(inComment) {
                this->continue_to_read_comment();
            }
            else if(*line_char == ' ' || *line_char == '\t') {
                this->advance_to_next_character();
            }
            else if(isalpha(*line_char) || *line_char == '_') {
                this->read_identifier();
            }
            else if(isdigit(*line_char)) {
                this->read_number();
            }
            else if(*line_char == '/' && *(line_char + 1) == '/') {
                break;
            }
            else if(*line_char == '/' && *(line_char + 1) == '*') {
                this->read_comment();
            }
            else if(*line_char == '-' && isdigit(*(line_char + 1))) {
                current_word += '-';
                this->advance_to_next_character();
                this->read_number();
            }
            else if(*line_char == '+' || *line_char == '-' || *line_char == '*'
            || *line_char == '/' || *line_char == '=' || *line_char == '&'
            || *line_char == '|' || *line_char == '<' || *line_char == '>'
            || *line_char == '!' || *line_char == '%') {
                this->read_symbol();
            }
            else if(*line_char == '"') {
                line_char++;
                this->read_string();
            }
            else if(*line_char == '{') {
                current_word += *line_char;
                this->add_token_to_stream(Token_Type::left_curly_bracket);
                current_word = "";
                this->advance_to_next_character();
            }
            else if(*line_char == '}') {
                current_word += *line_char;
                this->add_token_to_stream(Token_Type::right_curly_bracket);
                current_word = "";
                this->advance_to_next_character();
            }
            else if(*line_char == '(') {
                current_word += *line_char;
                this->add_token_to_stream(Token_Type::left_round_bracket);
                current_word = "";
                this->advance_to_next_character();
            }
            else if(*line_char == ')') {
                current_word += *line_char;
                this->add_token_to_stream(Token_Type::right_round_bracket);
                current_word = "";
                this->advance_to_next_character();
            }
            else if(*line_char == ';') {
                current_word += *line_char;
                this->add_token_to_stream(Token_Type::semicolon);
                current_word = "";
                this->advance_to_next_character();
            }
            else {
                this->read_invalid_token();
            }
        }
    }
    current_word = "eof";
    this->add_token_to_stream(Token_Type::eof);
}